

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_RK4.cpp
# Opt level: O3

double * __thiscall PP_RK4::RK4step(PP_RK4 *this,double x,double y,double z,double t,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  undefined4 extraout_var;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  undefined4 local_38;
  double *pdVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar7 = (**this->_vptr_PP_RK4)();
  pdVar8 = (double *)CONCAT44(extraout_var,iVar7);
  dVar2 = *pdVar8;
  dVar3 = pdVar8[1];
  *pdVar8 = dVar2 * dt;
  pdVar8[1] = dVar3 * dt;
  dVar1 = pdVar8[2];
  pdVar8[2] = dVar1 * dt;
  iVar7 = (**this->_vptr_PP_RK4)
                    (dVar2 * dt * 0.5 + x,dVar3 * dt * 0.5 + y,dVar1 * dt * 0.5 + z,this);
  pdVar9 = (double *)CONCAT44(extraout_var_00,iVar7);
  dVar2 = *pdVar9;
  dVar3 = pdVar9[1];
  *pdVar9 = dVar2 * dt;
  pdVar9[1] = dVar3 * dt;
  dVar1 = pdVar9[2];
  pdVar9[2] = dVar1 * dt;
  local_38 = SUB84(dt * 0.5 + t,0);
  iVar7 = (**this->_vptr_PP_RK4)
                    (dVar2 * dt * 0.5 + x,dVar3 * dt * 0.5 + y,dVar1 * dt * 0.5 + z,local_38,this);
  pdVar10 = (double *)CONCAT44(extraout_var_01,iVar7);
  dVar2 = *pdVar10;
  dVar3 = pdVar10[1];
  *pdVar10 = dVar2 * dt;
  pdVar10[1] = dVar3 * dt;
  dVar1 = pdVar10[2];
  pdVar10[2] = dVar1 * dt;
  iVar7 = (**this->_vptr_PP_RK4)(x + dVar2 * dt,dVar3 * dt + y,dVar1 * dt + z,SUB84(t + dt,0),this);
  pdVar11 = (double *)CONCAT44(extraout_var_02,iVar7);
  dVar2 = *pdVar11;
  dVar3 = pdVar11[1];
  *pdVar11 = dVar2 * dt;
  pdVar11[1] = dVar3 * dt;
  dVar1 = pdVar11[2];
  pdVar11[2] = dt * dVar1;
  pdVar12 = (double *)operator_new__(0x18);
  dVar4 = pdVar8[1];
  dVar5 = pdVar9[1];
  dVar6 = pdVar10[1];
  *pdVar12 = (*pdVar10 + *pdVar10 + *pdVar9 + *pdVar9 + *pdVar8 + dVar2 * dt) * 0.16666666666666666;
  pdVar12[1] = (dVar6 + dVar6 + dVar5 + dVar5 + dVar4 + dVar3 * dt) * 0.16666666666666666;
  pdVar12[2] = (pdVar10[2] + pdVar10[2] + pdVar9[2] + pdVar9[2] + pdVar8[2] + dt * dVar1) *
               0.16666666666666666;
  operator_delete(pdVar8,8);
  operator_delete(pdVar9,8);
  operator_delete(pdVar10,8);
  operator_delete(pdVar11,8);
  return pdVar12;
}

Assistant:

double* PP_RK4::RK4step(double x, double y, double z, double t, double dt)
{
    double* K1 = RK4K1(x, y, z, t, dt);
    double* K2 = RK4K2(x, y, z, K1[0], K1[1], K1[2], t, dt);
    double* K3 = RK4K3(x, y, z, K2[0], K2[1], K2[2], t, dt);
    double* K4 = RK4K4(x, y, z, K3[0], K3[1], K3[2], t, dt);
    double* dr = new double[3];
    dr[0] = (1.0/6.0)*(K1[0] + 2.0*K2[0] + 2*K3[0] + K4[0]);
    dr[1] = (1.0/6.0)*(K1[1] + 2.0*K2[1] + 2*K3[1] + K4[1]);
    dr[2] = (1.0/6.0)*(K1[2] + 2.0*K2[2] + 2*K3[2] + K4[2]);
    delete K1;
    delete K2;
    delete K3;
    delete K4;
    return dr;
}